

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_test.cpp
# Opt level: O0

void __thiscall
environment_test_variable_path_default_Test::TestBody
          (environment_test_variable_path_default_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *variable_path;
  char **in_stack_ffffffffffffff50;
  char **in_stack_ffffffffffffff58;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  AssertHelper local_80;
  Message local_78;
  int local_70;
  undefined4 local_6c;
  AssertionResult local_68;
  uint local_54;
  AssertHelper local_50;
  Message local_48 [3];
  char *local_30;
  undefined8 local_28;
  AssertionResult local_20;
  char *local_10;
  
  local_30 = (char *)environment_variable_path_create("UNKNOWN","default_path",0xd,0);
  local_28 = 0;
  local_10 = local_30;
  testing::internal::CmpHelperNE<char_const*,char_const*>
            (in_stack_ffffffffffffff68,
             (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    in_stack_ffffffffffffff68 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10cc4d);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/environment_test/source/environment_test.cpp"
               ,0x58,in_stack_ffffffffffffff68);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x10cc9b);
  }
  local_54 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ccf7);
  if (local_54 == 0) {
    local_6c = 0;
    local_70 = strcmp(local_10,"default_path/");
    this_00 = &local_68;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_ffffffffffffff68,
               (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),(int *)this_00,
               (int *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_78);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x10cdaa);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/environment_test/source/environment_test.cpp"
                 ,0x5a,message);
      testing::internal::AssertHelper::operator=(&local_80,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      testing::Message::~Message((Message *)0x10cdf8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ce3e);
    environment_variable_path_destroy(local_10);
  }
  return;
}

Assistant:

TEST_F(environment_test, variable_path_default)
{
	static const char variable_path_name[] = "UNKNOWN";

	char *variable_path = environment_variable_path_create(variable_path_name, "default_path", sizeof("default_path"), NULL);

	ASSERT_NE((const char *)NULL, (const char *)variable_path);

	EXPECT_EQ((int)0, (int)strcmp(variable_path, "default_path" ENVIRONMENT_VARIABLE_PATH_SEPARATOR_STR));

	environment_variable_path_destroy(variable_path);
}